

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O3

QColor QtMWidgets::lighterColor(QColor *c,int b)

{
  undefined8 uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  QColor QVar4;
  int h;
  int a;
  int v;
  int local_50 [4];
  undefined8 local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  if (b < 1) {
    uVar1 = *(undefined8 *)c;
    uVar2 = *(ulong *)((long)&c->ct + 4);
  }
  else {
    local_50[0] = 0;
    local_50[3] = 0;
    local_50[2] = 0;
    local_50[1] = 0;
    auVar3 = QColor::toHsv();
    local_40 = auVar3._0_8_;
    local_38 = auVar3._8_4_;
    local_34 = auVar3._12_2_;
    QColor::getHsv((int *)&local_40,local_50,local_50 + 3,local_50 + 2);
    local_50[2] = b + local_50[2];
    if (0xff < local_50[2]) {
      local_50[3] = (local_50[3] - local_50[2]) + 0xff;
      if (local_50[3] < 1) {
        local_50[3] = 0;
      }
      local_50[2] = 0xff;
    }
    QColor::setHsv((Spec)&local_40,local_50[0],local_50[3],local_50[2]);
    auVar3 = QColor::convertTo((Spec)&local_40);
    uVar1 = auVar3._0_8_;
    uVar2 = auVar3._8_8_ & 0xffffffffffff;
  }
  QVar4._8_8_ = uVar2;
  QVar4._0_8_ = uVar1;
  return QVar4;
}

Assistant:

QColor
lighterColor( const QColor & c, int b )
{
	if( b <= 0 )
		return c;

	int h = 0;
	int s = 0;
	int v = 0;
	int a = 0;

	QColor hsv = c.toHsv();
	hsv.getHsv( &h, &s, &v, &a );

	v += b;

	if( v > 255 )
	{
		s -= v - 255;

		if( s < 0 ) s = 0;

		v = 255;
	}

	hsv.setHsv( h, s, v, a );

	return hsv.convertTo( c.spec() );
}